

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O2

saidx64_t divbwt64(sauchar_t *T,sauchar_t *U,saidx64_t *A,saidx64_t n)

{
  byte bVar1;
  ulong *SA;
  saidx64_t *bucket_A;
  saidx64_t *bucket_B;
  saidx64_t sVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  uint uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  saidx64_t sStack_50;
  
  if (n < 0 || (U == (sauchar_t *)0x0 || T == (sauchar_t *)0x0)) {
    sStack_50 = -1;
  }
  else if ((ulong)n < 2) {
    if (n == 1) {
      *U = *T;
      sStack_50 = 1;
    }
    else {
      sStack_50 = 0;
    }
  }
  else {
    SA = (ulong *)A;
    if (A == (saidx64_t *)0x0) {
      SA = (ulong *)malloc(n * 8 + 8);
    }
    bucket_A = (saidx64_t *)malloc(0x800);
    bucket_B = (saidx64_t *)malloc(0x80000);
    if (bucket_B == (saidx64_t *)0x0 || (bucket_A == (saidx64_t *)0x0 || SA == (ulong *)0x0)) {
      sStack_50 = -2;
    }
    else {
      sVar2 = sort_typeBstar(T,(saidx64_t *)SA,bucket_A,bucket_B,n);
      if (0 < sVar2) {
        for (uVar16 = 0xfe; -1 < (int)uVar16; uVar16 = uVar16 - 1) {
          uVar6 = uVar16 << 8;
          lVar12 = bucket_B[(int)(uVar16 + 1 | uVar6)];
          puVar4 = SA + bucket_A[(ulong)uVar16 + 1];
          puVar7 = (ulong *)0x0;
          uVar14 = 0xffffffffffffffff;
          while (puVar4 = puVar4 + -1, SA + lVar12 <= puVar4) {
            uVar11 = *puVar4;
            if ((long)uVar11 < 1) {
              if (uVar11 != 0) {
                *puVar4 = ~uVar11;
              }
            }
            else {
              bVar1 = T[uVar11 - 1];
              uVar13 = (ulong)bVar1;
              *puVar4 = ~uVar13;
              if (uVar11 == 1) {
                uVar3 = 0;
              }
              else {
                uVar3 = -uVar11;
                if (T[uVar11 - 2] <= bVar1) {
                  uVar3 = uVar11 - 1;
                }
              }
              uVar15 = (uint)uVar14;
              if (uVar15 == bVar1) {
                uVar14 = uVar14 & 0xffffffff;
              }
              else {
                if (-1 < (int)uVar15) {
                  bucket_B[(int)(uVar15 | uVar6)] = (long)puVar7 - (long)SA >> 3;
                }
                puVar7 = SA + bucket_B[(long)(int)uVar6 | uVar13];
                uVar14 = uVar13;
              }
              *puVar7 = uVar3;
              puVar7 = puVar7 + -1;
            }
          }
        }
      }
      uVar11 = (ulong)T[n + -1];
      uVar14 = ~(ulong)T[n + -2];
      if (T[n + -1] <= T[n + -2]) {
        uVar14 = n - 1;
      }
      puVar4 = SA + bucket_A[uVar11] + 1;
      puVar4[-1] = uVar14;
      puVar8 = SA;
      for (puVar7 = SA; puVar7 < SA + n; puVar7 = puVar7 + 1) {
        uVar14 = *puVar7;
        if ((long)uVar14 < 1) {
          puVar9 = puVar7;
          if (uVar14 != 0) {
            *puVar7 = ~uVar14;
            puVar9 = puVar8;
          }
        }
        else {
          bVar1 = T[uVar14 - 1];
          uVar13 = (ulong)bVar1;
          *puVar7 = uVar13;
          if (uVar14 == 1) {
            uVar14 = 0;
          }
          else if (T[uVar14 - 2] < bVar1) {
            uVar14 = ~(ulong)T[uVar14 - 2];
          }
          else {
            uVar14 = uVar14 - 1;
          }
          if ((uint)uVar11 != (uint)bVar1) {
            bucket_A[uVar11] = (long)puVar4 - (long)SA >> 3;
            puVar4 = SA + bucket_A[uVar13];
            uVar11 = uVar13;
          }
          *puVar4 = uVar14;
          puVar4 = puVar4 + 1;
          puVar9 = puVar8;
        }
        puVar8 = puVar9;
      }
      lVar10 = (long)puVar8 - (long)SA >> 3;
      *U = T[n + -1];
      lVar5 = 0;
      lVar12 = 0;
      if (0 < lVar10) {
        lVar12 = lVar10;
      }
      for (; lVar12 != lVar5; lVar5 = lVar5 + 1) {
        U[lVar5 + 1] = (sauchar_t)SA[lVar5];
      }
      while (lVar12 = lVar12 + 1, lVar12 < n) {
        U[lVar12] = (sauchar_t)SA[lVar12];
      }
      sStack_50 = lVar10 + 1;
    }
    free(bucket_B);
    free(bucket_A);
    if (A == (saidx64_t *)0x0) {
      free(SA);
    }
  }
  return sStack_50;
}

Assistant:

saidx_t
divbwt(const sauchar_t *T, sauchar_t *U, saidx_t *A, saidx_t n) {
  saidx_t *B;
  saidx_t *bucket_A, *bucket_B;
  saidx_t m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (saidx_t *)malloc((size_t)(n + 1) * sizeof(saidx_t)); }
  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n);
    pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (sauchar_t)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (sauchar_t)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}